

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttobin.cpp
# Opt level: O0

void __thiscall FootprintToBin::WriteBinFootprintFile(FootprintToBin *this)

{
  undefined1 local_1c [8];
  EventRow er;
  FootprintToBin *this_local;
  
  er._4_8_ = this;
  if (*(int *)&(this->super_ValidateFootprint).field_0x3074 <
      (this->super_ValidateFootprint).fr_.super_EventRow.intensity_bin_id) {
    fprintf(_stderr,
            "ERROR: Maximum intensity bin index of %d in header is less than that of %d in line %d:\n%s\n"
            ,(ulong)*(uint *)&(this->super_ValidateFootprint).field_0x3074,
            (ulong)(uint)(this->super_ValidateFootprint).fr_.super_EventRow.intensity_bin_id,
            (ulong)(uint)(this->super_ValidateFootprint).super_Validate.lineno_,
            &(this->super_ValidateFootprint).super_Validate);
    exit(1);
  }
  local_1c._0_4_ = (this->super_ValidateFootprint).fr_.super_EventRow.areaperil_id;
  local_1c._4_4_ = (this->super_ValidateFootprint).fr_.super_EventRow.intensity_bin_id;
  er.areaperil_id = (AREAPERIL_INT)(this->super_ValidateFootprint).fr_.super_EventRow.probability;
  this->rowCount_ = this->rowCount_ + 1;
  if ((this->zip_ & 1U) == 0) {
    fwrite(local_1c,0xc,1,(FILE *)this->fileOutBin_);
  }
  else {
    std::vector<EventRow,_std::allocator<EventRow>_>::push_back
              (&this->eventRows_,(value_type *)local_1c);
  }
  return;
}

Assistant:

void FootprintToBin::WriteBinFootprintFile() {

  // Check that intensity bin ID from file does not exceed maximum in header
  if (fr_.intensity_bin_id > maxIntensityBinIdx_) {
    fprintf(stderr, "ERROR: Maximum intensity bin index of %d in header is"
		    " less than that of %d in line %d:\n%s\n",
	    maxIntensityBinIdx_, fr_.intensity_bin_id, lineno_, line_);
    exit(EXIT_FAILURE);
  }
	

  EventRow er = { fr_.areaperil_id, fr_.intensity_bin_id, fr_.probability };
  ++rowCount_;   // Increment row counter

  // Write binary footprint file if no zipped output requested
  if (!zip_) {

    fwrite(&er, sizeof(er), 1, fileOutBin_);
    return;

  }

  // Otherwise, store in vector
  eventRows_.push_back(er);

}